

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.h
# Opt level: O3

void __thiscall
slang::ast::ForLoopStatement::visitExprs<LookupLhsIdentifier&>
          (ForLoopStatement *this,LookupLhsIdentifier *visitor)

{
  size_t sVar1;
  pointer ppEVar2;
  Expression *pEVar3;
  long lVar4;
  
  sVar1 = (this->initializers)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (this->initializers)._M_ptr;
    lVar4 = 0;
    do {
      pEVar3 = *(Expression **)((long)ppEVar2 + lVar4);
      Expression::visitExpression<slang::ast::Expression_const,LookupLhsIdentifier&>
                (pEVar3,pEVar3,visitor);
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  pEVar3 = this->stopExpr;
  if (pEVar3 != (Expression *)0x0) {
    Expression::visitExpression<slang::ast::Expression_const,LookupLhsIdentifier&>
              (pEVar3,pEVar3,visitor);
  }
  sVar1 = (this->steps)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (this->steps)._M_ptr;
    lVar4 = 0;
    do {
      pEVar3 = *(Expression **)((long)ppEVar2 + lVar4);
      Expression::visitExpression<slang::ast::Expression_const,LookupLhsIdentifier&>
                (pEVar3,pEVar3,visitor);
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto init : initializers)
            init->visit(visitor);
        if (stopExpr)
            stopExpr->visit(visitor);
        for (auto step : steps)
            step->visit(visitor);
    }